

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::JoinSkins_3DGS_MDL7
          (MDLImporter *this,aiMaterial *pcMat1,aiMaterial *pcMat2,aiMaterial *pcMatOut)

{
  aiReturn aVar1;
  bool bVar2;
  undefined1 local_430 [8];
  aiString sString;
  int iVal;
  aiMaterial *pcMatOut_local;
  aiMaterial *pcMat2_local;
  aiMaterial *pcMat1_local;
  MDLImporter *this_local;
  
  bVar2 = false;
  if ((pcMat1 != (aiMaterial *)0x0) && (bVar2 = false, pcMat2 != (aiMaterial *)0x0)) {
    bVar2 = pcMatOut != (aiMaterial *)0x0;
  }
  unique0x10000183 = pcMatOut;
  if (!bVar2) {
    __assert_fail("__null != pcMat1 && __null != pcMat2 && __null != pcMatOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MDL/MDLLoader.cpp"
                  ,0x793,
                  "void Assimp::MDLImporter::JoinSkins_3DGS_MDL7(aiMaterial *, aiMaterial *, aiMaterial *)"
                 );
  }
  aiMaterial::CopyPropertyList(pcMatOut,pcMat1);
  sString.data[0x3f8] = '\0';
  sString.data[0x3f9] = '\0';
  sString.data[0x3fa] = '\0';
  sString.data[0x3fb] = '\0';
  aiMaterial::AddProperty<int>
            (stack0xffffffffffffffd8,(int *)(sString.data + 0x3f8),1,"$tex.uvwsrc",1,0);
  aiString::aiString((aiString *)local_430);
  aVar1 = aiGetMaterialString(pcMat2,"$tex.file",1,0,(aiString *)local_430);
  if (aVar1 == aiReturn_SUCCESS) {
    sString.data[0x3f8] = '\x01';
    sString.data[0x3f9] = '\0';
    sString.data[0x3fa] = '\0';
    sString.data[0x3fb] = '\0';
    aiMaterial::AddProperty<int>
              (stack0xffffffffffffffd8,(int *)(sString.data + 0x3f8),1,"$tex.uvwsrc",1,1);
    aiMaterial::AddProperty(stack0xffffffffffffffd8,(aiString *)local_430,"$tex.file",1,1);
  }
  return;
}

Assistant:

void MDLImporter::JoinSkins_3DGS_MDL7(
    aiMaterial* pcMat1,
    aiMaterial* pcMat2,
    aiMaterial* pcMatOut)
{
    ai_assert(NULL != pcMat1 && NULL != pcMat2 && NULL != pcMatOut);

    // first create a full copy of the first skin property set
    // and assign it to the output material
    aiMaterial::CopyPropertyList(pcMatOut,pcMat1);

    int iVal = 0;
    pcMatOut->AddProperty<int>(&iVal,1,AI_MATKEY_UVWSRC_DIFFUSE(0));

    // then extract the diffuse texture from the second skin,
    // setup 1 as UV source and we have it
    aiString sString;
    if(AI_SUCCESS == aiGetMaterialString ( pcMat2, AI_MATKEY_TEXTURE_DIFFUSE(0),&sString )) {
        iVal = 1;
        pcMatOut->AddProperty<int>(&iVal,1,AI_MATKEY_UVWSRC_DIFFUSE(1));
        pcMatOut->AddProperty(&sString,AI_MATKEY_TEXTURE_DIFFUSE(1));
    }
}